

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard.cpp
# Opt level: O2

string * __thiscall xcard::generateCard_abi_cxx11_(string *__return_storage_ptr__,xcard *this)

{
  string *psVar1;
  result_type __val;
  ulong uVar2;
  longlong lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  default_random_engine generator;
  string cardbuf;
  uniform_int_distribution<unsigned_int> dist;
  string local_13d8;
  random_device rd;
  
  cardbuf._M_dataplus._M_p = (pointer)&cardbuf.field_2;
  cardbuf._M_string_length = 0;
  cardbuf.field_2._M_local_buf[0] = '\0';
  std::random_device::random_device(&rd);
  uVar2 = std::random_device::_M_getval();
  iVar4 = (int)((uVar2 & 0xffffffff) % 0x7fffffff);
  generator._M_x = (unsigned_long)(iVar4 + (uint)(iVar4 == 0));
  lVar3 = std::__cxx11::stoll(&this->prefix,(size_t *)0x0,10);
  if (-1 < lVar3) {
    std::__cxx11::string::insert((ulong)&cardbuf,(string *)0x0);
  }
  dist._M_param._M_a = 0;
  dist._M_param._M_b = 9;
  iVar4 = 0;
  if (0 < 0x10 - (int)cardbuf._M_string_length) {
    iVar4 = 0x10 - (int)cardbuf._M_string_length;
  }
  while( true ) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&cardbuf);
    iVar5 = iVar4;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      psVar1 = (string *)__return_storage_ptr__->_M_string_length;
      __val = std::uniform_int_distribution<unsigned_int>::operator()(&dist,&generator);
      std::__cxx11::to_string(&local_13d8,__val);
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,psVar1);
      std::__cxx11::string::~string((string *)&local_13d8);
    }
    bVar6 = LuhnCheck(this,__return_storage_ptr__);
    if (bVar6) break;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::random_device::~random_device(&rd);
  std::__cxx11::string::~string((string *)&cardbuf);
  return __return_storage_ptr__;
}

Assistant:

std::string xcard::generateCard()
{

    std::string cardbuf;

    /* Seed */
    std::random_device rd;

    /* Random number generator */
    std::default_random_engine generator(rd());

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    std::uniform_int_distribution<unsigned int> dist(0, 9);

    int initial_length = cardbuf.length();
    int genreq = 16 - initial_length;

    while (true)
    {

        std::string cc = cardbuf;
        
        for (int i = 0; i < genreq; i++)
        {
            cc.insert(cc.length(), std::to_string(dist(generator)));
        }

        if (LuhnCheck(cc) == true)
        {
            return cc;
        }
    }
}